

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void nuts_logger(nng_log_level level,nng_log_facility fac,char *msgid,char *msg)

{
  int local_2c;
  char *pcStack_28;
  int color;
  char *lstr;
  char *msg_local;
  char *msgid_local;
  nng_log_facility fac_local;
  nng_log_level level_local;
  
  switch(level) {
  case NNG_LOG_ERR:
    pcStack_28 = "ERROR";
    local_2c = 5;
    break;
  case NNG_LOG_WARN:
    pcStack_28 = "WARNING";
    local_2c = 2;
    break;
  case NNG_LOG_NOTICE:
    pcStack_28 = "NOTICE";
    local_2c = 3;
    break;
  case NNG_LOG_INFO:
    pcStack_28 = "INFO";
    local_2c = 0;
    break;
  case NNG_LOG_DEBUG:
    pcStack_28 = "DEBUG";
    local_2c = 0;
    break;
  default:
    pcStack_28 = "LEVEL UNKNOWN";
    local_2c = 0;
  }
  acutest_message_color_(local_2c,"%s: %s: %s",pcStack_28,msgid,msg);
  return;
}

Assistant:

void
nuts_logger(nng_log_level level, nng_log_facility fac, const char *msgid,
    const char *msg)
{
	(void) fac;
	char *lstr;
	int   color;
	switch (level) {
	case NNG_LOG_DEBUG:
		lstr  = "DEBUG";
		color = NUTS_COLOR_DEFAULT_;
		break;
	case NNG_LOG_INFO:
		lstr  = "INFO";
		color = NUTS_COLOR_DEFAULT_;
		break;
	case NNG_LOG_NOTICE:
		lstr  = "NOTICE";
		color = NUTS_COLOR_DEFAULT_INTENSIVE_;
		break;
	case NNG_LOG_WARN:
		lstr  = "WARNING";
		color = NUTS_COLOR_RED_;
		break;
	case NNG_LOG_ERR:
		lstr  = "ERROR";
		color = NUTS_COLOR_RED_INTENSIVE_;
		break;
	default:
		lstr  = "LEVEL UNKNOWN";
		color = NUTS_COLOR_DEFAULT_;
		break;
	}
	acutest_message_color_(color, "%s: %s: %s", lstr, msgid, msg);
}